

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

void soul::Optimisations::removeUnusedObjects(Program *program)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Module *mainModule;
  Module *mainModule_00;
  
  mainModule = Program::getMainProcessor(program);
  do {
    do {
      mainModule_00 = Program::getMainProcessor(program);
      bVar1 = removeUnusedFunctions(program,mainModule_00,false);
      bVar2 = removeUnusedStructs(program);
      bVar3 = removeUnusedModules(program,mainModule);
    } while (bVar1);
  } while ((bVar2) || (bVar3));
  return;
}

Assistant:

static void removeUnusedObjects (Program& program)
    {
        auto& mainModule = program.getMainProcessor();

        bool objectsRemoved = false;

        do
        {
            objectsRemoved = removeUnusedFunctions (program, program.getMainProcessor(), false);
            objectsRemoved |= removeUnusedStructs (program);
            objectsRemoved |= removeUnusedModules (program, mainModule);
        }
        while (objectsRemoved);
    }